

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O3

void __thiscall
tchecker::typed_sequence_statement_t::typed_sequence_statement_t
          (typed_sequence_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_statement_t> *first,
          shared_ptr<const_tchecker::typed_statement_t> *second)

{
  element_type *peVar1;
  shared_ptr<const_tchecker::statement_t> local_28;
  shared_ptr<const_tchecker::statement_t> local_18;
  
  *(undefined ***)&this->super_typed_statement_t = &PTR__typed_statement_t_0021ad78;
  (this->super_typed_statement_t)._type = type;
  peVar1 = (first->super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_18.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_18.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)((long)&peVar1->field_0x0 + *(long *)(*(long *)peVar1 + -0x38));
  }
  local_18.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (first->super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>)
          ._M_refcount._M_pi;
  if (local_18.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar1 = (second->
           super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  if (peVar1 == (element_type *)0x0) {
    local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)((long)&peVar1->field_0x0 + *(long *)(*(long *)peVar1 + -0x38));
  }
  local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (second->super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>
          )._M_refcount._M_pi;
  if (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  sequence_statement_t::sequence_statement_t
            (&this->super_sequence_statement_t,&PTR_construction_vtable_56__00219f08,&local_18,
             &local_28);
  if (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_18.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  *(undefined8 *)&this->super_typed_statement_t = 0x219e50;
  *(undefined8 *)&this->super_sequence_statement_t = 0x219ec0;
  return;
}

Assistant:

typed_sequence_statement_t::typed_sequence_statement_t(enum tchecker::statement_type_t type,
                                                       std::shared_ptr<tchecker::typed_statement_t const> const & first,
                                                       std::shared_ptr<tchecker::typed_statement_t const> const & second)
    : tchecker::typed_statement_t(type), tchecker::sequence_statement_t(first, second)
{
}